

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_decompress4X1_usingDTable_internal_fast
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 HUF_DecompressFastLoopFn loopFn)

{
  undefined1 *puVar1;
  uint uVar2;
  size_t code;
  ulong uVar3;
  size_t sVar4;
  long in_RDX;
  ulong uVar5;
  size_t in_RSI;
  undefined1 *in_RDI;
  long in_R8;
  code *in_R9;
  bool bVar6;
  size_t err_code_1;
  BIT_DStream_t bit;
  int i;
  BYTE *segmentEnd;
  size_t segmentSize;
  size_t err_code;
  size_t ret;
  HUF_DecompressFastArgs args;
  BYTE *oend;
  BYTE *iend;
  void *dt;
  BYTE *pStart;
  BIT_DStream_status result_2;
  U32 nbBytes_2;
  BIT_DStream_status result_1;
  U32 nbBytes_1;
  BIT_DStream_status result;
  U32 nbBytes;
  BYTE c;
  size_t val;
  BYTE c_2;
  size_t val_2;
  BYTE c_3;
  size_t val_3;
  BYTE c_1;
  size_t val_1;
  BYTE c_4;
  size_t val_4;
  BYTE c_5;
  size_t val_5;
  undefined4 in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  HUF_DecompressFastArgs *in_stack_fffffffffffffd00;
  BIT_DStream_t *in_stack_fffffffffffffd08;
  uint local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  int local_2cc;
  undefined1 *local_2c8;
  HUF_DTable *in_stack_fffffffffffffd40;
  size_t in_stack_fffffffffffffd48;
  void *in_stack_fffffffffffffd50;
  HUF_DecompressFastArgs *in_stack_fffffffffffffd58;
  HUF_DecompressFastArgs *in_stack_fffffffffffffd60;
  HUF_DecompressFastArgs *in_stack_fffffffffffffd68;
  HUF_DecompressFastArgs *local_290;
  ulong auStack_288 [3];
  undefined1 *local_270;
  HUF_DecompressFastArgs *local_240;
  undefined1 *local_210;
  HUF_DecompressFastArgs *local_208;
  long local_200;
  code *local_1f8;
  size_t local_1d8;
  undefined1 *local_1d0;
  size_t local_1c8;
  undefined1 *local_1c0;
  U32 local_1b4;
  long local_1b0;
  undefined1 *local_1a8;
  BIT_DStream_t *local_1a0;
  undefined1 *local_198;
  BIT_DStream_status local_190;
  uint local_18c;
  BIT_DStream_t *local_188;
  BIT_DStream_status local_17c;
  BIT_DStream_status local_178;
  uint local_174;
  BIT_DStream_t *local_170;
  BIT_DStream_status local_164;
  BIT_DStream_status local_160;
  uint local_15c;
  BIT_DStream_t *local_158;
  BIT_DStream_status local_150;
  undefined1 local_149;
  size_t local_148;
  U32 local_13c;
  long local_138;
  BIT_DStream_t *local_130;
  uint local_124;
  BIT_DStream_t *local_120;
  undefined1 local_111;
  size_t local_110;
  U32 local_104;
  long local_100;
  BIT_DStream_t *local_f8;
  uint local_ec;
  BIT_DStream_t *local_e8;
  undefined1 local_d9;
  size_t local_d8;
  U32 local_cc;
  long local_c8;
  BIT_DStream_t *local_c0;
  uint local_b4;
  BIT_DStream_t *local_b0;
  undefined1 local_a1;
  size_t local_a0;
  U32 local_94;
  long local_90;
  BIT_DStream_t *local_88;
  uint local_7c;
  BIT_DStream_t *local_78;
  undefined1 local_69;
  size_t local_68;
  U32 local_5c;
  long local_58;
  BIT_DStream_t *local_50;
  uint local_44;
  BIT_DStream_t *local_40;
  undefined1 local_31;
  size_t local_30;
  U32 local_24;
  long local_20;
  BIT_DStream_t *local_18;
  uint local_c;
  BIT_DStream_t *local_8;
  
  local_200 = in_R8 + 4;
  local_208 = (HUF_DecompressFastArgs *)(in_RDX + 6);
  local_210 = in_RDI + in_RSI;
  local_1f8 = in_R9;
  local_1d8 = in_RSI;
  local_1d0 = in_RDI;
  code = HUF_DecompressFastArgs_init
                   (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                    (size_t)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                    in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  sVar4 = code;
  uVar2 = ERR_isError(code);
  local_1c8 = code;
  if (uVar2 == 0) {
    if (sVar4 == 0) {
      local_1c8 = 0;
    }
    else {
      if (in_stack_fffffffffffffd58 < local_240) {
        __assert_fail("args.ip[0] >= args.ilimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8f5f,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      (*local_1f8)(&stack0xfffffffffffffd58);
      if (in_stack_fffffffffffffd58 < local_208) {
        __assert_fail("args.ip[0] >= iend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8f65,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (in_stack_fffffffffffffd60 < local_208) {
        __assert_fail("args.ip[1] >= iend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8f66,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (in_stack_fffffffffffffd68 < local_208) {
        __assert_fail("args.ip[2] >= iend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8f67,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (local_290 < local_208) {
        __assert_fail("args.ip[3] >= iend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8f68,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (local_210 < local_270) {
        __assert_fail("args.op[3] <= oend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8f69,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      uVar3 = local_1d8 + 3 >> 2;
      local_2c8 = local_1d0;
      for (local_2cc = 0; local_2cc < 4; local_2cc = local_2cc + 1) {
        if ((ulong)((long)local_210 - (long)local_2c8) < uVar3) {
          local_2c8 = local_210;
        }
        else {
          local_2c8 = local_2c8 + uVar3;
        }
        in_stack_fffffffffffffd00 =
             (HUF_DecompressFastArgs *)
             HUF_initRemainingDStream
                       (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                        in_stack_fffffffffffffcfc,(BYTE *)0x3ad83a);
        uVar2 = ERR_isError((size_t)in_stack_fffffffffffffd00);
        if (uVar2 != 0) {
          return (size_t)in_stack_fffffffffffffd00;
        }
        local_1c0 = (undefined1 *)auStack_288[local_2cc];
        local_1a0 = (BIT_DStream_t *)&stack0xfffffffffffffd08;
        local_1a8 = local_2c8;
        local_1b0 = local_200;
        local_1b4 = 0xb;
        local_198 = local_1c0;
        if ((long)local_2c8 - (long)local_1c0 < 4) {
          local_170 = local_1a0;
          if (local_2f0 < 0x41) {
            if (local_2e8 < local_2d8) {
              if (local_2e8 == local_2e0) {
                if (local_2f0 < 0x40) {
                  local_164 = BIT_DStream_endOfBuffer;
                }
                else {
                  local_164 = BIT_DStream_completed;
                }
              }
              else {
                local_174 = local_2f0 >> 3;
                uVar5 = (ulong)local_174;
                if (local_2e8 + -uVar5 < local_2e0) {
                  local_174 = (int)local_2e8 - (int)local_2e0;
                }
                local_178 = (BIT_DStream_status)(local_2e8 + -uVar5 < local_2e0);
                local_2e8 = local_2e8 + -(ulong)local_174;
                sVar4 = MEM_readLEST((void *)CONCAT44(in_stack_fffffffffffffcfc,
                                                      in_stack_fffffffffffffcf8));
                local_170->bitContainer = sVar4;
                local_164 = local_178;
              }
            }
            else {
              local_164 = BIT_reloadDStreamFast
                                    ((BIT_DStream_t *)
                                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
            }
          }
          else {
            local_164 = BIT_DStream_overflow;
          }
        }
        else {
          while( true ) {
            local_158 = local_1a0;
            if (local_1a0->bitsConsumed < 0x41) {
              if (local_1a0->ptr < local_1a0->limitPtr) {
                if (local_1a0->ptr == local_1a0->start) {
                  if (local_1a0->bitsConsumed < 0x40) {
                    local_150 = BIT_DStream_endOfBuffer;
                  }
                  else {
                    local_150 = BIT_DStream_completed;
                  }
                }
                else {
                  local_15c = local_1a0->bitsConsumed >> 3;
                  bVar6 = local_1a0->ptr + -(ulong)local_15c < local_1a0->start;
                  if (bVar6) {
                    local_15c = (int)local_1a0->ptr - (int)local_1a0->start;
                  }
                  local_160 = (BIT_DStream_status)bVar6;
                  local_1a0->ptr = local_1a0->ptr + -(ulong)local_15c;
                  local_158->bitsConsumed = local_158->bitsConsumed + local_15c * -8;
                  sVar4 = MEM_readLEST((void *)CONCAT44(in_stack_fffffffffffffcfc,
                                                        in_stack_fffffffffffffcf8));
                  local_158->bitContainer = sVar4;
                  local_150 = local_160;
                }
              }
              else {
                local_150 = BIT_reloadDStreamFast
                                      ((BIT_DStream_t *)
                                       CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                                      );
              }
            }
            else {
              local_150 = BIT_DStream_overflow;
            }
            if (local_150 != BIT_DStream_unfinished || local_1a8 + -3 <= local_198) break;
            uVar2 = MEM_64bits();
            if (uVar2 != 0) {
              local_130 = local_1a0;
              local_138 = local_1b0;
              local_13c = local_1b4;
              local_148 = BIT_lookBitsFast(local_1a0,local_1b4);
              local_149 = *(undefined1 *)(local_138 + 1 + local_148 * 2);
              local_120 = local_130;
              local_124 = (uint)*(byte *)(local_138 + local_148 * 2);
              local_130->bitsConsumed = local_124 + local_130->bitsConsumed;
              *local_198 = local_149;
              local_198 = local_198 + 1;
            }
            MEM_64bits();
            local_88 = local_1a0;
            local_90 = local_1b0;
            local_94 = local_1b4;
            local_a0 = BIT_lookBitsFast(local_1a0,local_1b4);
            local_a1 = *(undefined1 *)(local_90 + 1 + local_a0 * 2);
            local_78 = local_88;
            local_7c = (uint)*(byte *)(local_90 + local_a0 * 2);
            local_88->bitsConsumed = local_7c + local_88->bitsConsumed;
            *local_198 = local_a1;
            local_198 = local_198 + 1;
            uVar2 = MEM_64bits();
            if (uVar2 != 0) {
              local_f8 = local_1a0;
              local_100 = local_1b0;
              local_104 = local_1b4;
              local_110 = BIT_lookBitsFast(local_1a0,local_1b4);
              local_111 = *(undefined1 *)(local_100 + 1 + local_110 * 2);
              local_e8 = local_f8;
              local_ec = (uint)*(byte *)(local_100 + local_110 * 2);
              local_f8->bitsConsumed = local_ec + local_f8->bitsConsumed;
              *local_198 = local_111;
              local_198 = local_198 + 1;
            }
            local_c0 = local_1a0;
            local_c8 = local_1b0;
            local_cc = local_1b4;
            local_d8 = BIT_lookBitsFast(local_1a0,local_1b4);
            local_d9 = *(undefined1 *)(local_c8 + 1 + local_d8 * 2);
            local_b0 = local_c0;
            local_b4 = (uint)*(byte *)(local_c8 + local_d8 * 2);
            local_c0->bitsConsumed = local_b4 + local_c0->bitsConsumed;
            *local_198 = local_d9;
            local_198 = local_198 + 1;
          }
        }
        uVar2 = MEM_32bits();
        if (uVar2 != 0) {
          while( true ) {
            local_188 = local_1a0;
            if (local_1a0->bitsConsumed < 0x41) {
              if (local_1a0->ptr < local_1a0->limitPtr) {
                if (local_1a0->ptr == local_1a0->start) {
                  if (local_1a0->bitsConsumed < 0x40) {
                    local_17c = BIT_DStream_endOfBuffer;
                  }
                  else {
                    local_17c = BIT_DStream_completed;
                  }
                }
                else {
                  local_18c = local_1a0->bitsConsumed >> 3;
                  bVar6 = local_1a0->ptr + -(ulong)local_18c < local_1a0->start;
                  if (bVar6) {
                    local_18c = (int)local_1a0->ptr - (int)local_1a0->start;
                  }
                  local_190 = (BIT_DStream_status)bVar6;
                  local_1a0->ptr = local_1a0->ptr + -(ulong)local_18c;
                  local_188->bitsConsumed = local_188->bitsConsumed + local_18c * -8;
                  sVar4 = MEM_readLEST((void *)CONCAT44(in_stack_fffffffffffffcfc,
                                                        in_stack_fffffffffffffcf8));
                  local_188->bitContainer = sVar4;
                  local_17c = local_190;
                }
              }
              else {
                local_17c = BIT_reloadDStreamFast
                                      ((BIT_DStream_t *)
                                       CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                                      );
              }
            }
            else {
              local_17c = BIT_DStream_overflow;
            }
            if (local_17c != BIT_DStream_unfinished || local_1a8 <= local_198) break;
            local_50 = local_1a0;
            local_58 = local_1b0;
            local_5c = local_1b4;
            local_68 = BIT_lookBitsFast(local_1a0,local_1b4);
            local_69 = *(undefined1 *)(local_58 + 1 + local_68 * 2);
            local_40 = local_50;
            local_44 = (uint)*(byte *)(local_58 + local_68 * 2);
            local_50->bitsConsumed = local_44 + local_50->bitsConsumed;
            puVar1 = local_198;
            local_198 = local_198 + 1;
            *puVar1 = local_69;
          }
        }
        while (local_198 < local_1a8) {
          local_18 = local_1a0;
          local_20 = local_1b0;
          local_24 = local_1b4;
          local_30 = BIT_lookBitsFast(local_1a0,local_1b4);
          local_31 = *(undefined1 *)(local_20 + 1 + local_30 * 2);
          local_8 = local_18;
          local_c = (uint)*(byte *)(local_20 + local_30 * 2);
          local_18->bitsConsumed = local_c + local_18->bitsConsumed;
          puVar1 = local_198;
          local_198 = local_198 + 1;
          *puVar1 = local_31;
        }
        auStack_288[local_2cc] = (ulong)(local_1a8 + (auStack_288[local_2cc] - (long)local_1c0));
        if ((undefined1 *)auStack_288[local_2cc] != local_2c8) {
          return 0xffffffffffffffec;
        }
      }
      if (local_1d8 == 0) {
        __assert_fail("dstSize != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8f7e,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      local_1c8 = local_1d8;
    }
  }
  return local_1c8;
}

Assistant:

static HUF_FAST_BMI2_ATTRS
size_t
HUF_decompress4X1_usingDTable_internal_fast(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable,
    HUF_DecompressFastLoopFn loopFn)
{
    void const* dt = DTable + 1;
    const BYTE* const iend = (const BYTE*)cSrc + 6;
    BYTE* const oend = (BYTE*)dst + dstSize;
    HUF_DecompressFastArgs args;
    {   size_t const ret = HUF_DecompressFastArgs_init(&args, dst, dstSize, cSrc, cSrcSize, DTable);
        FORWARD_IF_ERROR(ret, "Failed to init fast loop args");
        if (ret == 0)
            return 0;
    }

    assert(args.ip[0] >= args.ilimit);
    loopFn(&args);

    /* Our loop guarantees that ip[] >= ilimit and that we haven't
    * overwritten any op[].
    */
    assert(args.ip[0] >= iend);
    assert(args.ip[1] >= iend);
    assert(args.ip[2] >= iend);
    assert(args.ip[3] >= iend);
    assert(args.op[3] <= oend);
    (void)iend;

    /* finish bit streams one by one. */
    {   size_t const segmentSize = (dstSize+3) / 4;
        BYTE* segmentEnd = (BYTE*)dst;
        int i;
        for (i = 0; i < 4; ++i) {
            BIT_DStream_t bit;
            if (segmentSize <= (size_t)(oend - segmentEnd))
                segmentEnd += segmentSize;
            else
                segmentEnd = oend;
            FORWARD_IF_ERROR(HUF_initRemainingDStream(&bit, &args, i, segmentEnd), "corruption");
            /* Decompress and validate that we've produced exactly the expected length. */
            args.op[i] += HUF_decodeStreamX1(args.op[i], &bit, segmentEnd, (HUF_DEltX1 const*)dt, HUF_DECODER_FAST_TABLELOG);
            if (args.op[i] != segmentEnd) return ERROR(corruption_detected);
        }
    }

    /* decoded size */
    assert(dstSize != 0);
    return dstSize;
}